

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O0

void jinit_forward_dct(j_compress_ptr cinfo)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long *in_RDI;
  int i;
  my_fdct_ptr fdct;
  int local_14;
  
  puVar2 = (undefined8 *)(**(code **)in_RDI[1])(in_RDI,1,0x90);
  in_RDI[0x3d] = (long)puVar2;
  *puVar2 = start_pass_fdctmgr;
  iVar1 = *(int *)((long)in_RDI + 0x114);
  if (iVar1 == 0) {
    puVar2[1] = forward_DCT;
    iVar1 = jsimd_can_fdct_islow();
    if (iVar1 == 0) {
      puVar2[2] = jpeg_fdct_islow;
    }
    else {
      puVar2[2] = jsimd_fdct_islow;
    }
  }
  else if (iVar1 == 1) {
    puVar2[1] = forward_DCT;
    iVar1 = jsimd_can_fdct_ifast();
    if (iVar1 == 0) {
      puVar2[2] = jpeg_fdct_ifast;
    }
    else {
      puVar2[2] = jsimd_fdct_ifast;
    }
  }
  else if (iVar1 == 2) {
    puVar2[1] = forward_DCT_float;
    iVar1 = jsimd_can_fdct_float();
    if (iVar1 == 0) {
      puVar2[10] = jpeg_fdct_float;
    }
    else {
      puVar2[10] = jsimd_fdct_float;
    }
  }
  else {
    *(undefined4 *)(*in_RDI + 0x28) = 0x30;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (*(uint *)((long)in_RDI + 0x114) < 2) {
    iVar1 = jsimd_can_convsamp();
    if (iVar1 == 0) {
      puVar2[3] = convsamp;
    }
    else {
      puVar2[3] = jsimd_convsamp;
    }
    iVar1 = jsimd_can_quantize();
    if (iVar1 == 0) {
      puVar2[4] = quantize;
    }
    else {
      puVar2[4] = jsimd_quantize;
    }
  }
  else if (*(uint *)((long)in_RDI + 0x114) == 2) {
    iVar1 = jsimd_can_convsamp_float();
    if (iVar1 == 0) {
      puVar2[0xb] = convsamp_float;
    }
    else {
      puVar2[0xb] = jsimd_convsamp_float;
    }
    iVar1 = jsimd_can_quantize_float();
    if (iVar1 == 0) {
      puVar2[0xc] = quantize_float;
    }
    else {
      puVar2[0xc] = jsimd_quantize_float;
    }
  }
  else {
    *(undefined4 *)(*in_RDI + 0x28) = 0x30;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (*(int *)((long)in_RDI + 0x114) == 2) {
    uVar3 = (**(code **)in_RDI[1])(in_RDI,1,0x100);
    puVar2[0x11] = uVar3;
  }
  else {
    uVar3 = (**(code **)in_RDI[1])(in_RDI,1,0x80);
    puVar2[9] = uVar3;
  }
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    puVar2[(long)local_14 + 5] = 0;
    puVar2[(long)local_14 + 0xd] = 0;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_forward_dct(j_compress_ptr cinfo)
{
  my_fdct_ptr fdct;
  int i;

  fdct = (my_fdct_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_fdct_controller));
  cinfo->fdct = (struct jpeg_forward_dct *)fdct;
  fdct->pub.start_pass = start_pass_fdctmgr;

  /* First determine the DCT... */
  switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
  case JDCT_ISLOW:
    fdct->pub.forward_DCT = forward_DCT;
    if (jsimd_can_fdct_islow())
      fdct->dct = jsimd_fdct_islow;
    else
      fdct->dct = jpeg_fdct_islow;
    break;
#endif
#ifdef DCT_IFAST_SUPPORTED
  case JDCT_IFAST:
    fdct->pub.forward_DCT = forward_DCT;
    if (jsimd_can_fdct_ifast())
      fdct->dct = jsimd_fdct_ifast;
    else
      fdct->dct = jpeg_fdct_ifast;
    break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
  case JDCT_FLOAT:
    fdct->pub.forward_DCT = forward_DCT_float;
    if (jsimd_can_fdct_float())
      fdct->float_dct = jsimd_fdct_float;
    else
      fdct->float_dct = jpeg_fdct_float;
    break;
#endif
  default:
    ERREXIT(cinfo, JERR_NOT_COMPILED);
    break;
  }

  /* ...then the supporting stages. */
  switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
  case JDCT_ISLOW:
#endif
#ifdef DCT_IFAST_SUPPORTED
  case JDCT_IFAST:
#endif
#if defined(DCT_ISLOW_SUPPORTED) || defined(DCT_IFAST_SUPPORTED)
    if (jsimd_can_convsamp())
      fdct->convsamp = jsimd_convsamp;
    else
      fdct->convsamp = convsamp;
    if (jsimd_can_quantize())
      fdct->quantize = jsimd_quantize;
    else
      fdct->quantize = quantize;
    break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
  case JDCT_FLOAT:
    if (jsimd_can_convsamp_float())
      fdct->float_convsamp = jsimd_convsamp_float;
    else
      fdct->float_convsamp = convsamp_float;
    if (jsimd_can_quantize_float())
      fdct->float_quantize = jsimd_quantize_float;
    else
      fdct->float_quantize = quantize_float;
    break;
#endif
  default:
    ERREXIT(cinfo, JERR_NOT_COMPILED);
    break;
  }

  /* Allocate workspace memory */
#ifdef DCT_FLOAT_SUPPORTED
  if (cinfo->dct_method == JDCT_FLOAT)
    fdct->float_workspace = (FAST_FLOAT *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  sizeof(FAST_FLOAT) * DCTSIZE2);
  else
#endif
    fdct->workspace = (DCTELEM *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  sizeof(DCTELEM) * DCTSIZE2);

  /* Mark divisor tables unallocated */
  for (i = 0; i < NUM_QUANT_TBLS; i++) {
    fdct->divisors[i] = NULL;
#ifdef DCT_FLOAT_SUPPORTED
    fdct->float_divisors[i] = NULL;
#endif
  }
}